

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O3

dsa_key_material_t * crypto_malloc_dsa(DSA *dsa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  dsa_key_material_t *keyMat;
  uchar *to;
  uchar *to_00;
  uchar *to_01;
  uchar *to_02;
  uchar *to_03;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_priv_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  BIGNUM *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  if ((dsa != (DSA *)0x0) &&
     (keyMat = (dsa_key_material_t *)malloc(0x50), keyMat != (dsa_key_material_t *)0x0)) {
    local_38 = (BIGNUM *)0x0;
    local_40 = (BIGNUM *)0x0;
    local_48 = (BIGNUM *)0x0;
    local_50 = (BIGNUM *)0x0;
    local_58 = (BIGNUM *)0x0;
    DSA_get0_pqg(dsa,&local_38,&local_40);
    DSA_get0_key(dsa,&local_58,&local_50);
    iVar1 = BN_num_bits(local_38);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)keyMat = (long)(iVar2 >> 3);
    iVar3 = BN_num_bits(local_40);
    iVar1 = iVar3 + 0xe;
    if (-1 < iVar3 + 7) {
      iVar1 = iVar3 + 7;
    }
    *(long *)(keyMat + 8) = (long)(iVar1 >> 3);
    iVar4 = BN_num_bits(local_48);
    iVar3 = iVar4 + 0xe;
    if (-1 < iVar4 + 7) {
      iVar3 = iVar4 + 7;
    }
    *(long *)(keyMat + 0x10) = (long)(iVar3 >> 3);
    iVar5 = BN_num_bits(local_50);
    iVar4 = iVar5 + 0xe;
    if (-1 < iVar5 + 7) {
      iVar4 = iVar5 + 7;
    }
    *(long *)(keyMat + 0x18) = (long)(iVar4 >> 3);
    iVar6 = BN_num_bits(local_58);
    iVar5 = iVar6 + 0xe;
    if (-1 < iVar6 + 7) {
      iVar5 = iVar6 + 7;
    }
    *(long *)(keyMat + 0x20) = (long)(iVar5 >> 3);
    to = (uchar *)malloc((long)(iVar2 >> 3));
    *(uchar **)(keyMat + 0x28) = to;
    to_00 = (uchar *)malloc((long)(iVar1 >> 3));
    *(uchar **)(keyMat + 0x30) = to_00;
    to_01 = (uchar *)malloc((long)(iVar3 >> 3));
    *(uchar **)(keyMat + 0x38) = to_01;
    to_02 = (uchar *)malloc((long)(iVar4 >> 3));
    *(uchar **)(keyMat + 0x40) = to_02;
    to_03 = (uchar *)malloc((long)(iVar5 >> 3));
    *(uchar **)(keyMat + 0x48) = to_03;
    if ((((to != (uchar *)0x0) && (to_00 != (uchar *)0x0)) && (to_01 != (uchar *)0x0)) &&
       ((to_02 != (uchar *)0x0 && (to_03 != (uchar *)0x0)))) {
      BN_bn2bin(local_38,to);
      BN_bn2bin(local_40,to_00);
      BN_bn2bin(local_48,to_01);
      BN_bn2bin(local_50,to_02);
      BN_bn2bin(local_58,to_03);
      return keyMat;
    }
    crypto_free_dsa(keyMat);
  }
  return (dsa_key_material_t *)0x0;
}

Assistant:

dsa_key_material_t* crypto_malloc_dsa(DSA* dsa)
{
	if (dsa == NULL)
	{
		return NULL;
	}

	dsa_key_material_t* keyMat = (dsa_key_material_t*)malloc(sizeof(dsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_priv_key = NULL;
	const BIGNUM* bn_pub_key = NULL;
	DSA_get0_pqg(dsa, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(dsa, &bn_pub_key, &bn_priv_key);

	keyMat->sizeP = BN_num_bytes(bn_p);
	keyMat->sizeQ = BN_num_bytes(bn_q);
	keyMat->sizeG = BN_num_bytes(bn_g);
	keyMat->sizeX = BN_num_bytes(bn_priv_key);
	keyMat->sizeY = BN_num_bytes(bn_pub_key);

	keyMat->bigP = (CK_VOID_PTR)malloc(keyMat->sizeP);
	keyMat->bigQ = (CK_VOID_PTR)malloc(keyMat->sizeQ);
	keyMat->bigG = (CK_VOID_PTR)malloc(keyMat->sizeG);
	keyMat->bigX = (CK_VOID_PTR)malloc(keyMat->sizeX);
	keyMat->bigY = (CK_VOID_PTR)malloc(keyMat->sizeY);

	if (!keyMat->bigP || !keyMat->bigQ || !keyMat->bigG || !keyMat->bigX || !keyMat->bigY)
	{
		crypto_free_dsa(keyMat);
		return NULL;
	}

	BN_bn2bin(bn_p, (unsigned char*)keyMat->bigP);
	BN_bn2bin(bn_q, (unsigned char*)keyMat->bigQ);
	BN_bn2bin(bn_g, (unsigned char*)keyMat->bigG);
	BN_bn2bin(bn_priv_key, (unsigned char*)keyMat->bigX);
	BN_bn2bin(bn_pub_key, (unsigned char*)keyMat->bigY);

	return keyMat;
}